

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

bool __thiscall sptk::Matrix::Transpose(Matrix *this,Matrix *transposed_matrix)

{
  double dVar1;
  const_reference ppdVar2;
  reference ppdVar3;
  Matrix *in_RSI;
  Matrix *in_RDI;
  int j;
  int i;
  int local_20;
  int local_1c;
  bool local_1;
  
  if ((in_RSI == (Matrix *)0x0) || (in_RDI == in_RSI)) {
    local_1 = false;
  }
  else {
    if ((in_RSI->num_row_ != in_RDI->num_column_) || (in_RSI->num_column_ != in_RDI->num_row_)) {
      Resize(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    }
    for (local_1c = 0; local_1c < in_RDI->num_column_; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < in_RDI->num_row_; local_20 = local_20 + 1) {
        ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            (&in_RDI->index_,(long)local_20);
        dVar1 = (*ppdVar2)[local_1c];
        ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                            (&in_RSI->index_,(long)local_1c);
        (*ppdVar3)[local_20] = dVar1;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Matrix::Transpose(Matrix* transposed_matrix) const {
  if (NULL == transposed_matrix || this == transposed_matrix) {
    return false;
  }

  if (transposed_matrix->num_row_ != num_column_ ||
      transposed_matrix->num_column_ != num_row_) {
    transposed_matrix->Resize(num_column_, num_row_);
  }

  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      transposed_matrix->index_[i][j] = index_[j][i];
    }
  }

  return true;
}